

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdRootNodeHasCommonVars(Kit_DsdObj_t *pObj0,Kit_DsdObj_t *pObj1)

{
  int iVar1;
  int iVar2;
  uint local_28;
  uint local_24;
  uint k;
  uint i;
  Kit_DsdObj_t *pObj1_local;
  Kit_DsdObj_t *pObj0_local;
  
  local_24 = 0;
  do {
    if ((uint)*pObj0 >> 0x1a <= local_24) {
      return 0;
    }
    iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pObj0[1].field_0x0 + (ulong)local_24 * 2));
    if (iVar1 < 4) {
      for (local_28 = 0; local_28 < (uint)*pObj1 >> 0x1a; local_28 = local_28 + 1) {
        iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pObj0[1].field_0x0 + (ulong)local_24 * 2));
        iVar2 = Abc_Lit2Var((uint)*(ushort *)(&pObj1[1].field_0x0 + (ulong)local_28 * 2));
        if (iVar1 == iVar2) {
          return 1;
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Kit_DsdRootNodeHasCommonVars( Kit_DsdObj_t * pObj0, Kit_DsdObj_t * pObj1 )
{
    unsigned i, k;
    for ( i = 0; i < pObj0->nFans; i++ )
    {
        if ( Abc_Lit2Var(pObj0->pFans[i]) >= 4 )
            continue;
        for ( k = 0; k < pObj1->nFans; k++ )
            if ( Abc_Lit2Var(pObj0->pFans[i]) == Abc_Lit2Var(pObj1->pFans[k]) )
                return 1;
    }
    return 0;
}